

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void __thiscall YAJLImage::scan_markers(YAJLImage *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  YAJLImage *local_10;
  
  sVar1 = bitio::bitio_stream::read(this->bstream,0x10,in_RDX,in_RCX);
  if (sVar1 == 0xffd8) {
    local_10 = this;
    std::vector<YAJLFrame,std::allocator<YAJLFrame>>::
    emplace_back<YAJLMiscData*,bitio::bitio_stream*&>
              ((vector<YAJLFrame,std::allocator<YAJLFrame>> *)
               &(this->super_YAJLImageDescriptor).frames,(YAJLMiscData **)&local_10,&this->bstream);
    printf("Run completed at: %s for \'Image\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/image.cpp"
          );
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SOI not found",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void YAJLImage::scan_markers() {
    // First check for SOI marker
    if (bstream->read(0x10) != markers::SOI) {
        std::cout << "SOI not found" << std::endl;
        return;
    }
    // parse one frame
    frames.emplace_back(&misc, bstream);
#ifdef DEBUG
    printf("Run completed at: %s for 'Image'\n", __FILE__);
#endif
}